

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CombLoops.cpp
# Opt level: O3

SCCResult * __thiscall
StrongConnectedComponents::getAdjacencyList(StrongConnectedComponents *this,int node)

{
  uint uVar1;
  ulong *puVar2;
  pointer piVar3;
  pointer piVar4;
  pointer pvVar5;
  int root;
  int iVar6;
  vector<int,_std::allocator<int>_> *nodes;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var7;
  pointer *ppiVar8;
  long lVar9;
  ulong uVar10;
  ulong *__s;
  ulong uVar11;
  size_type __new_size;
  int local_4c;
  ulong local_48;
  int local_3c;
  SCCResult *local_38;
  
  __new_size = ((long)(this->adjListOriginal->
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->adjListOriginal->
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  local_4c = node;
  std::vector<int,_std::allocator<int>_>::resize(&this->lowlink,__new_size);
  std::vector<int,_std::allocator<int>_>::resize(&this->number,__new_size);
  std::vector<bool,_std::allocator<bool>_>::resize(&this->visited,__new_size,false);
  __s = (this->visited).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
        _M_start.super__Bit_iterator_base._M_p;
  puVar2 = (this->visited).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_p;
  uVar1 = (this->visited).super__Bvector_base<std::allocator<bool>_>._M_impl.
          super__Bvector_impl_data._M_finish.super__Bit_iterator_base._M_offset;
  if (__s != puVar2) {
    memset(__s,0,(long)puVar2 - (long)__s);
    __s = puVar2;
  }
  if (uVar1 != 0) {
    *__s = *__s & ~(0xffffffffffffffffU >> (-(char)uVar1 & 0x3fU));
  }
  piVar3 = (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish != piVar3) {
    (this->stack).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar3;
  }
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::_M_erase_at_end(&this->currentSCCs,
                    (this->currentSCCs).
                    super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  makeAdjListSubgraph(this,node);
  uVar11 = (ulong)node;
  if (uVar11 <= __new_size && __new_size - uVar11 != 0) {
    local_38 = &this->sccr_current;
    uVar10 = 0x800000000000003f;
    local_48 = 0x800000000000003f;
    do {
      root = (int)uVar11;
      iVar6 = root + 0x3f;
      if (-1 < root) {
        iVar6 = root;
      }
      if (((this->visited).super__Bvector_base<std::allocator<bool>_>._M_impl.
           super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p
           [(long)(iVar6 >> 6) +
            (ulong)((uVar11 & uVar10) < 0x8000000000000001) + 0xffffffffffffffff] >> (uVar11 & 0x3f)
          & 1) == 0) {
        getStrongConnectedComponents(this,root);
        nodes = getLowestIdComponent(this);
        uVar10 = local_48;
        if (nodes != (vector<int,_std::allocator<int>_> *)0x0) {
          piVar3 = (nodes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          piVar4 = (nodes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
          if (piVar3 != piVar4) {
            _Var7 = std::
                    __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                              (piVar3,piVar4,&local_4c);
            piVar3 = (nodes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            if (_Var7._M_current == piVar3) {
              local_3c = local_4c + 1;
              _Var7 = std::
                      __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                                ((nodes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                 super__Vector_impl_data._M_start,piVar3,&local_3c);
              if (_Var7._M_current ==
                  (nodes->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_finish) {
                local_4c = local_4c + 1;
                uVar10 = local_48;
                goto LAB_0017763d;
              }
            }
          }
          buildAdjList(this,nodes,local_38);
          pvVar5 = (this->sccr_current).adjList.
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar10 = local_48;
          if (pvVar5 != (this->sccr_current).adjList.
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish) {
            ppiVar8 = &(pvVar5->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
            lVar9 = 0;
            do {
              if (((_Vector_impl_data *)(ppiVar8 + -1))->_M_start != *ppiVar8) {
                (this->sccr_current).lowestNodeId = (ID_type)lVar9;
                return local_38;
              }
              lVar9 = lVar9 + 1;
              ppiVar8 = ppiVar8 + 3;
            } while (__new_size - lVar9 != 0);
          }
        }
      }
LAB_0017763d:
      uVar11 = uVar11 + 1;
    } while (uVar11 <= __new_size && __new_size - uVar11 != 0);
  }
  return &sccr_dummy;
}

Assistant:

SCCResult& StrongConnectedComponents::getAdjacencyList(int node) {
    auto adjListOriginal_s = adjListOriginal.size();
    lowlink.resize(adjListOriginal_s);
    number.resize(adjListOriginal_s);
    visited.resize(adjListOriginal_s);

    while (true) {
        std::fill(visited.begin(), visited.end(), false);
        stack.clear();
        currentSCCs.clear();

        makeAdjListSubgraph(node);
        for (int i = node; i < adjListOriginal_s; i++) {
            if (!visited[i]) {
                getStrongConnectedComponents(i);
                const std::vector<int>* nodes = getLowestIdComponent();
                if (nodes != nullptr && !nodes->empty() && !find_vec(*nodes, node) &&
                    !find_vec(*nodes, node + 1)) {
                    node++;
                    continue;
                }
                else if (nodes != nullptr) {
                    buildAdjList(*nodes, sccr_current);
                    auto& adjacencyList = sccr_current.getAdjListForWrite();
                    if (!adjacencyList.empty()) {
                        for (int j = 0; j < adjListOriginal_s; j++) {
                            if (!adjacencyList[j].empty()) {
                                sccr_current.setLowestNodeId(j);
                                return sccr_current;
                            }
                        }
                    }
                }
            }
        }
        return sccr_dummy;
    }
}